

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

leveldb * __thiscall leveldb::RandomString_abi_cxx11_(leveldb *this,Random *rnd,int len)

{
  int len_local;
  Random *rnd_local;
  string *r;
  
  std::__cxx11::string::string((string *)this);
  test::RandomString(rnd,len,(string *)this);
  return this;
}

Assistant:

static std::string RandomString(Random* rnd, int len) {
  std::string r;
  test::RandomString(rnd, len, &r);
  return r;
}